

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

void Mf_ManTruthQuit(void)

{
  if (s_vTtMem != (Vec_Mem_t *)0x0) {
    printf("TT = %d (%.2f %%)\n",((double)s_vTtMem->nEntries * 100.0) / (double)s_nCalls);
    Vec_MemHashFree(s_vTtMem);
    Vec_MemFree(s_vTtMem);
    s_vTtMem = (Vec_Mem_t *)0x0;
    s_nCalls = 0;
  }
  return;
}

Assistant:

void Mf_ManTruthQuit()
{
    if ( s_vTtMem == NULL )
        return;
    printf( "TT = %d (%.2f %%)\n", Vec_MemEntryNum(s_vTtMem), 100.0 * Vec_MemEntryNum(s_vTtMem) / s_nCalls );
    Vec_MemHashFree( s_vTtMem );
    Vec_MemFree( s_vTtMem );
    s_vTtMem = NULL;
    s_nCalls = 0;
}